

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall llvm::yaml::Input::endMapping(Input *this)

{
  bool bVar1;
  ret_type pMVar2;
  pointer hnode;
  Twine local_d0;
  StringRef local_b8;
  Twine local_a8;
  Twine local_90;
  Twine local_78;
  Twine local_60;
  StringRef local_48;
  StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
  *local_38;
  StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
  *NN;
  iterator __end1;
  iterator __begin1;
  NameToNode *__range1;
  MapHNode *MN;
  Input *this_local;
  
  bVar1 = std::error_code::operator_cast_to_bool(&this->EC);
  if ((!bVar1) &&
     (pMVar2 = dyn_cast_or_null<llvm::yaml::Input::MapHNode,llvm::yaml::Input::HNode>
                         (this->CurrentNode), pMVar2 != (ret_type)0x0)) {
    __end1 = StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
             ::begin(&pMVar2->Mapping);
    NN = (StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
          *)StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
            ::end(&pMVar2->Mapping);
    while (bVar1 = iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_&>
                   ::operator!=((iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_&>
                                 *)&__end1,
                                (StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
                                 *)&NN), bVar1) {
      local_38 = StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
                 ::operator*(&__end1);
      local_48 = StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
                 ::first(local_38);
      bVar1 = is_contained<llvm::SmallVector<std::__cxx11::string,6u>&,llvm::StringRef>
                        (&pMVar2->ValidKeys,&local_48);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        hnode = std::
                unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                ::get(&(local_38->
                       super_StringMapEntryStorage<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
                       ).second);
        Twine::Twine(&local_90,"unknown key \'");
        local_b8 = StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>
                   ::first(local_38);
        Twine::Twine(&local_a8,&local_b8);
        llvm::operator+(&local_78,&local_90,&local_a8);
        Twine::Twine(&local_d0,"\'");
        llvm::operator+(&local_60,&local_78,&local_d0);
        setError(this,hnode,&local_60);
        return;
      }
      StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
      ::operator++(&__end1.
                    super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                  );
    }
  }
  return;
}

Assistant:

void Input::endMapping() {
  if (EC)
    return;
  // CurrentNode can be null if the document is empty.
  MapHNode *MN = dyn_cast_or_null<MapHNode>(CurrentNode);
  if (!MN)
    return;
  for (const auto &NN : MN->Mapping) {
    if (!is_contained(MN->ValidKeys, NN.first())) {
      setError(NN.second.get(), Twine("unknown key '") + NN.first() + "'");
      break;
    }
  }
}